

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_cast_operators.hpp
# Opt level: O1

bool duckdb::TryDecimalStringCast<short,(char)44>
               (char *string_ptr,idx_t string_size,short *result,uint8_t width,uint8_t scale)

{
  byte bVar1;
  undefined4 uVar2;
  short sVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  undefined7 in_register_00000009;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  idx_t iVar10;
  char *pcVar11;
  char *buf;
  int iVar12;
  uint uVar13;
  byte bVar14;
  byte bVar15;
  ulong uVar16;
  ulong uVar17;
  bool bVar18;
  ExponentData exponent;
  bool local_53;
  DecimalCastData<short> local_52;
  IntegerCastData<short> local_46;
  uint local_44;
  ulong local_40;
  ulong local_38;
  
  bVar18 = false;
  local_52.result = 0;
  local_52.excessive_decimals = '\0';
  local_52.exponent_type = NONE;
  local_52.digit_count = '\0';
  local_52.decimal_count = '\0';
  local_52.round_set = false;
  local_52.should_round = false;
  uVar2 = local_52._4_4_;
  local_52.limit =
       *(StoreType *)
        (NumericHelper::POWERS_OF_TEN + (CONCAT71(in_register_00000009,width) & 0xffffffff) * 8);
  if (string_size == 0) goto LAB_00ba4101;
  uVar9 = 0;
  do {
    bVar15 = string_ptr[uVar9];
    if ((4 < bVar15 - 9) && (bVar15 != 0x20)) {
      local_52.digit_count = 0;
      local_52.decimal_count = 0;
      bVar14 = local_52.decimal_count;
      local_52.width = width;
      local_52.scale = scale;
      if (bVar15 == 0x2d) {
        local_52.result = 0;
        uVar7 = string_size - uVar9;
        uVar4 = 1;
        goto LAB_00ba39e2;
      }
      if (bVar15 == 0x30 && string_size - 1 != uVar9) {
        bVar1 = string_ptr[uVar9 + 1];
        if (bVar1 < 0x62) {
          if ((bVar1 == 0x42) || (bVar1 == 0x58)) {
LAB_00ba3c29:
            if (0xfffffffffffffffd < (string_size - uVar9) - 3) {
              local_52._4_4_ = uVar2;
              DecimalCastOperation::Finalize<duckdb::DecimalCastData<short>,false>(&local_52);
            }
            break;
          }
        }
        else if ((bVar1 == 0x62) || (bVar1 == 0x78)) goto LAB_00ba3c29;
      }
      uVar7 = string_size - uVar9;
      uVar5 = (ulong)(bVar15 == 0x2b);
      local_52.result = 0;
      uVar4 = uVar5;
      goto LAB_00ba3c6f;
    }
    uVar9 = uVar9 + 1;
  } while (string_size != uVar9);
  goto LAB_00ba40ff;
LAB_00ba39e2:
  do {
    if (uVar7 <= uVar4) {
      local_52._5_3_ = 0;
      goto LAB_00ba3af4;
    }
    bVar15 = string_ptr[uVar9 + uVar4] - 0x30;
    if (9 < bVar15) {
      local_52._5_3_ = 0;
      if (string_ptr[uVar9 + uVar4] != ',') goto LAB_00ba3ec2;
      uVar5 = uVar4 + 1;
      iVar8 = 3;
      uVar6 = uVar5;
      if (uVar7 <= uVar5) goto LAB_00ba3e97;
      local_44 = local_44 & 0xffffff00;
      local_53 = false;
      goto LAB_00ba3b69;
    }
    uVar5 = uVar4 + 1;
    if ((bVar15 == 0) && (local_52.result == 0)) {
LAB_00ba3a10:
      bVar18 = true;
      if ((~uVar4 + string_size != uVar9) && (string_ptr[uVar9 + 1 + uVar4] == '_')) {
        uVar5 = uVar4 + 2;
        if ((string_size - uVar4) - 2 == uVar9) {
          bVar18 = false;
        }
        else {
          bVar18 = (byte)(string_ptr[uVar9 + uVar5] - 0x30U) < 10;
        }
      }
    }
    else {
      if (((uint)width - (uint)scale != (uint)local_52.digit_count) &&
         (local_52.digit_count = local_52.digit_count + 1, -0xccd < local_52.result)) {
        local_52.result = local_52.result * 10 - (ushort)bVar15;
        goto LAB_00ba3a10;
      }
      bVar18 = false;
    }
    uVar4 = uVar5;
  } while (bVar18);
  goto LAB_00ba40ff;
  while (uVar6 = uVar16, uVar16 < uVar7) {
LAB_00ba3b69:
    bVar15 = string_ptr[uVar9 + uVar6] - 0x30;
    local_40 = uVar5;
    if (9 < bVar15) {
      iVar8 = 0;
      goto LAB_00ba3e73;
    }
    if ((bVar14 == scale) && ((char)local_44 == '\0')) {
      local_53 = 4 < bVar15;
      local_44 = CONCAT31(local_44._1_3_,1);
    }
    bVar18 = (uint)bVar14 + (uint)local_52.digit_count < 4;
    sVar3 = local_52.result * 10 - (ushort)bVar15;
    if (!bVar18) {
      sVar3 = local_52.result;
    }
    local_52.result = sVar3;
    bVar14 = bVar14 + bVar18;
    uVar16 = uVar6 + 1;
    if (((~uVar6 + string_size != uVar9) && (string_ptr[uVar9 + 1 + uVar6] == '_')) &&
       ((uVar16 = uVar6 + 2, (string_size - uVar6) - 2 == uVar9 ||
        (9 < (byte)(string_ptr[uVar9 + uVar16] - 0x30U))))) {
      local_52.decimal_count = bVar14;
      local_52.round_set = (bool)(char)local_44;
      local_52.should_round = local_53;
      uVar6 = uVar16;
      iVar12 = 1;
      goto LAB_00ba3eaf;
    }
  }
  iVar8 = 3;
LAB_00ba3e73:
  local_52.decimal_count = bVar14;
  local_52.round_set = (bool)(char)local_44;
  local_52.should_round = local_53;
LAB_00ba3e97:
  iVar12 = 1;
  if (uVar5 < uVar6) {
    iVar12 = iVar8;
  }
  if (1 < uVar4) {
    iVar12 = iVar8;
  }
LAB_00ba3eaf:
  uVar4 = uVar6;
  if (iVar12 != 3) {
    if (iVar12 != 0) goto LAB_00ba40ff;
LAB_00ba3ec2:
    bVar15 = string_ptr[uVar9 + uVar4];
    bVar18 = false;
    uVar13 = (uint)bVar15;
    if (bVar15 < 0x20) {
      if (4 < uVar13 - 9) goto LAB_00ba4101;
    }
    else {
      if ((bVar15 == 0x65) || (uVar13 == 0x45)) {
        if ((uVar4 != 1) && (uVar4 + 1 < uVar7)) {
          local_46.result = 0;
          pcVar11 = string_ptr + uVar9 + uVar4 + 1;
          iVar10 = ~uVar9 + (string_size - uVar4);
          if (*pcVar11 == '-') {
            bVar18 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)44>
                               (pcVar11,iVar10,&local_46,SUB81(uVar7,0));
          }
          else {
            bVar18 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)44>
                               (pcVar11,iVar10,&local_46,SUB81(uVar7,0));
          }
          if (bVar18 != false) {
            bVar18 = DecimalCastOperation::HandleExponent<duckdb::DecimalCastData<short>,true>
                               (&local_52,(int)local_46.result);
            goto LAB_00ba4101;
          }
        }
        goto LAB_00ba40ff;
      }
      if (uVar13 != 0x20) goto LAB_00ba4101;
    }
    uVar5 = uVar4 + 1;
    uVar4 = uVar5;
    if (uVar5 < uVar7) {
      do {
        if ((4 < (byte)string_ptr[uVar9 + uVar5] - 9) && (string_ptr[uVar9 + uVar5] != 0x20))
        goto LAB_00ba40ff;
        uVar5 = uVar5 + 1;
        uVar4 = uVar7;
      } while (uVar7 != uVar5);
    }
  }
LAB_00ba3af4:
  bVar18 = DecimalCastOperation::Finalize<duckdb::DecimalCastData<short>,true>(&local_52);
  if (bVar18) {
    bVar18 = 1 < uVar4;
    goto LAB_00ba4101;
  }
  goto LAB_00ba40ff;
LAB_00ba3c6f:
  do {
    if (uVar7 <= uVar4) {
      local_52._5_3_ = 0;
      goto LAB_00ba3d3f;
    }
    bVar15 = string_ptr[uVar9 + uVar4] - 0x30;
    if (9 < bVar15) {
      local_52._5_3_ = 0;
      if (string_ptr[uVar9 + uVar4] != ',') goto LAB_00ba3fc9;
      uVar6 = uVar4 + 1;
      iVar8 = 3;
      uVar16 = uVar6;
      if (uVar7 <= uVar6) goto LAB_00ba3f9f;
      local_53 = false;
      local_40 = local_40 & 0xffffffffffffff00;
      local_44 = (uint)local_52.digit_count;
      goto LAB_00ba3db2;
    }
    uVar6 = uVar4 + 1;
    if ((bVar15 == 0) && (local_52.result == 0)) {
LAB_00ba3c9d:
      bVar18 = true;
      if ((~uVar4 + string_size != uVar9) && (string_ptr[uVar9 + 1 + uVar4] == '_')) {
        uVar6 = uVar4 + 2;
        if ((string_size - uVar4) - 2 == uVar9) {
          bVar18 = false;
        }
        else {
          bVar18 = (byte)(string_ptr[uVar9 + uVar6] - 0x30U) < 10;
        }
      }
    }
    else {
      if (((uint)width - (uint)scale != (uint)local_52.digit_count) &&
         (local_52.digit_count = local_52.digit_count + 1, local_52.result < 0xccd)) {
        local_52.result = (ushort)bVar15 + local_52.result * 10;
        goto LAB_00ba3c9d;
      }
      bVar18 = false;
    }
    uVar4 = uVar6;
  } while (bVar18);
  goto LAB_00ba40ff;
  while (uVar16 = uVar17, uVar17 < uVar7) {
LAB_00ba3db2:
    bVar15 = string_ptr[uVar9 + uVar16] - 0x30;
    local_38 = uVar6;
    if (9 < bVar15) {
      iVar8 = 0;
      goto LAB_00ba3f7b;
    }
    if ((bVar14 == scale) && (local_53 == false)) {
      local_40 = CONCAT71(local_40._1_7_,4 < bVar15);
      local_53 = true;
    }
    bVar18 = bVar14 + local_44 < 4;
    sVar3 = (ushort)bVar15 + local_52.result * 10;
    if (!bVar18) {
      sVar3 = local_52.result;
    }
    local_52.result = sVar3;
    bVar14 = bVar14 + bVar18;
    uVar17 = uVar16 + 1;
    if (((~uVar16 + string_size != uVar9) && (string_ptr[uVar9 + 1 + uVar16] == '_')) &&
       ((uVar17 = uVar16 + 2, (string_size - uVar16) - 2 == uVar9 ||
        (9 < (byte)(string_ptr[uVar9 + uVar17] - 0x30U))))) {
      local_52.decimal_count = bVar14;
      local_52.round_set = local_53;
      local_52.should_round = (bool)(undefined1)local_40;
      uVar16 = uVar17;
      iVar12 = 1;
      goto LAB_00ba3fb6;
    }
  }
  iVar8 = 3;
LAB_00ba3f7b:
  local_52.decimal_count = bVar14;
  local_52.round_set = local_53;
  local_52.should_round = (bool)(undefined1)local_40;
LAB_00ba3f9f:
  iVar12 = 1;
  if (uVar6 < uVar16) {
    iVar12 = iVar8;
  }
  if (uVar5 < uVar4) {
    iVar12 = iVar8;
  }
LAB_00ba3fb6:
  uVar4 = uVar16;
  if (iVar12 != 3) {
    if (iVar12 != 0) goto LAB_00ba40ff;
LAB_00ba3fc9:
    pcVar11 = string_ptr + uVar4;
    bVar15 = pcVar11[uVar9];
    bVar18 = false;
    uVar13 = (uint)bVar15;
    if (bVar15 < 0x20) {
      if (4 < uVar13 - 9) goto LAB_00ba4101;
    }
    else {
      if ((bVar15 == 0x65) || (uVar13 == 0x45)) {
        if ((uVar4 != uVar5) && (uVar4 + 1 < uVar7)) {
          local_46.result = 0;
          buf = pcVar11 + uVar9 + 1;
          iVar10 = ~uVar9 + (string_size - uVar4);
          if (*buf == '-') {
            bVar18 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)44>
                               (buf,iVar10,&local_46,SUB81(pcVar11,0));
          }
          else {
            bVar18 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)44>
                               (buf,iVar10,&local_46,SUB81(pcVar11,0));
          }
          if (bVar18 != false) {
            bVar18 = DecimalCastOperation::HandleExponent<duckdb::DecimalCastData<short>,false>
                               (&local_52,(int)local_46.result);
            goto LAB_00ba4101;
          }
        }
        goto LAB_00ba40ff;
      }
      if (uVar13 != 0x20) goto LAB_00ba4101;
    }
    uVar6 = uVar4 + 1;
    uVar4 = uVar6;
    if (uVar6 < uVar7) {
      do {
        if ((4 < (byte)string_ptr[uVar9 + uVar6] - 9) && (string_ptr[uVar9 + uVar6] != 0x20))
        goto LAB_00ba40ff;
        uVar6 = uVar6 + 1;
        uVar4 = uVar7;
      } while (uVar7 != uVar6);
    }
  }
LAB_00ba3d3f:
  bVar18 = DecimalCastOperation::Finalize<duckdb::DecimalCastData<short>,false>(&local_52);
  if (bVar18) {
    bVar18 = uVar5 < uVar4;
    goto LAB_00ba4101;
  }
LAB_00ba40ff:
  bVar18 = false;
LAB_00ba4101:
  if (bVar18 != false) {
    *result = local_52.result;
  }
  return bVar18;
}

Assistant:

bool TryDecimalStringCast(const char *string_ptr, idx_t string_size, T &result, uint8_t width, uint8_t scale) {
	DecimalCastData<T> state;
	state.result = 0;
	state.width = width;
	state.scale = scale;
	state.digit_count = 0;
	state.decimal_count = 0;
	state.excessive_decimals = 0;
	state.exponent_type = ExponentType::NONE;
	state.round_set = false;
	state.should_round = false;
	state.limit = UnsafeNumericCast<T>(DecimalCastTraits<T>::POWERS_OF_TEN_CLASS::POWERS_OF_TEN[width]);
	if (!TryIntegerCast<DecimalCastData<T>, true, true, DecimalCastOperation, false, decimal_separator>(
	        string_ptr, string_size, state, false)) {
		return false;
	}
	result = state.result;
	return true;
}